

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

void ssh_shutdown_internal(Ssh *ssh)

{
  Ssh *ssh_local;
  
  expire_timer_context(ssh);
  if (ssh->connshare != (ssh_sharing_state *)0x0) {
    sharestate_free(ssh->connshare);
    ssh->connshare = (ssh_sharing_state *)0x0;
  }
  if (ssh->pinger != (Pinger *)0x0) {
    pinger_free(ssh->pinger);
    ssh->pinger = (Pinger *)0x0;
  }
  if (ssh->base_layer != (PacketProtocolLayer *)0x0) {
    ssh_ppl_free(ssh->base_layer);
    ssh->base_layer = (PacketProtocolLayer *)0x0;
  }
  ssh->cl = (ConnectionLayer *)0x0;
  return;
}

Assistant:

static void ssh_shutdown_internal(Ssh *ssh)
{
    expire_timer_context(ssh);

    if (ssh->connshare) {
        sharestate_free(ssh->connshare);
        ssh->connshare = NULL;
    }

    if (ssh->pinger) {
        pinger_free(ssh->pinger);
        ssh->pinger = NULL;
    }

    /*
     * We only need to free the base PPL, which will free the others
     * (if any) transitively.
     */
    if (ssh->base_layer) {
        ssh_ppl_free(ssh->base_layer);
        ssh->base_layer = NULL;
    }

    ssh->cl = NULL;
}